

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

bool __thiscall args::Group::HasFlag(Group *this)

{
  bool bVar1;
  Group *this_00;
  reference ppBVar2;
  long in_RDI;
  Group *group;
  Base *child;
  const_iterator __end2;
  const_iterator __begin2;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *__range2;
  vector<args::Base_*,_std::allocator<args::Base_*>_> *in_stack_ffffffffffffffa8;
  Base *in_stack_ffffffffffffffb0;
  long local_48;
  __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
  local_20;
  
  this_00 = (Group *)(in_RDI + 0x30);
  local_20._M_current =
       (Base **)std::vector<args::Base_*,_std::allocator<args::Base_*>_>::begin
                          (in_stack_ffffffffffffffa8);
  std::vector<args::Base_*,_std::allocator<args::Base_*>_>::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (!bVar1) {
      return false;
    }
    ppBVar2 = __gnu_cxx::
              __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
              ::operator*(&local_20);
    in_stack_ffffffffffffffb0 = *ppBVar2;
    if (in_stack_ffffffffffffffb0 == (Base *)0x0) {
      local_48 = 0;
    }
    else {
      local_48 = __dynamic_cast(in_stack_ffffffffffffffb0,&Base::typeinfo,&FlagBase::typeinfo,0);
    }
    if (local_48 != 0) break;
    if (in_stack_ffffffffffffffb0 == (Base *)0x0) {
      in_stack_ffffffffffffffa8 = (vector<args::Base_*,_std::allocator<args::Base_*>_> *)0x0;
    }
    else {
      in_stack_ffffffffffffffa8 =
           (vector<args::Base_*,_std::allocator<args::Base_*>_> *)
           __dynamic_cast(in_stack_ffffffffffffffb0,&Base::typeinfo,&typeinfo,0);
    }
    if ((in_stack_ffffffffffffffa8 != (vector<args::Base_*,_std::allocator<args::Base_*>_> *)0x0) &&
       (bVar1 = HasFlag(this_00), bVar1)) {
      return true;
    }
    __gnu_cxx::
    __normal_iterator<args::Base_*const_*,_std::vector<args::Base_*,_std::allocator<args::Base_*>_>_>
    ::operator++(&local_20);
  }
  return true;
}

Assistant:

bool HasFlag() const
            {
                for (Base *child: children)
                {
                    if (dynamic_cast<FlagBase *>(child))
                    {
                        return true;
                    }
                    if (auto group = dynamic_cast<Group *>(child))
                    {
                        if (group->HasFlag())
                        {
                            return true;
                        }
                    }
                }
                return false;
            }